

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlDocDumpMemoryFormat(xmlDocPtr cur,xmlChar **mem,int *size,int format)

{
  xmlCharEncoding xVar1;
  xmlChar *pxVar2;
  xmlOutputBufferPtr buf_00;
  size_t sVar3;
  xmlCharEncoding enc;
  char *encoding;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  int format_local;
  int *size_local;
  xmlChar **mem_local;
  xmlDocPtr cur_local;
  
  encoding = (char *)0x0;
  xmlInitParser();
  if ((mem != (xmlChar **)0x0) && (size != (int *)0x0)) {
    if (cur == (xmlDocPtr)0x0) {
      *mem = (xmlChar *)0x0;
      *size = 0;
    }
    else {
      pxVar2 = htmlGetMetaEncoding(cur);
      if (pxVar2 == (xmlChar *)0x0) {
        encoding = (char *)xmlFindCharEncodingHandler("HTML");
        if ((xmlCharEncodingHandlerPtr)encoding == (xmlCharEncodingHandlerPtr)0x0) {
          encoding = (char *)xmlFindCharEncodingHandler("ascii");
        }
      }
      else {
        xVar1 = xmlParseCharEncoding((char *)pxVar2);
        if ((xVar1 != XML_CHAR_ENCODING_UTF8) &&
           (encoding = (char *)xmlFindCharEncodingHandler((char *)pxVar2),
           (xmlCharEncodingHandlerPtr)encoding == (xmlCharEncodingHandlerPtr)0x0)) {
          htmlSaveErr(0x57b,(xmlNodePtr)0x0,(char *)pxVar2);
        }
      }
      buf_00 = xmlAllocOutputBufferInternal((xmlCharEncodingHandlerPtr)encoding);
      if (buf_00 == (xmlOutputBufferPtr)0x0) {
        *mem = (xmlChar *)0x0;
        *size = 0;
      }
      else {
        htmlDocContentDumpFormatOutput(buf_00,cur,(char *)0x0,format);
        xmlOutputBufferFlush(buf_00);
        if (buf_00->conv == (xmlBufPtr)0x0) {
          sVar3 = xmlBufUse(buf_00->buffer);
          *size = (int)sVar3;
          pxVar2 = xmlBufContent(buf_00->buffer);
          pxVar2 = xmlStrndup(pxVar2,*size);
          *mem = pxVar2;
        }
        else {
          sVar3 = xmlBufUse(buf_00->conv);
          *size = (int)sVar3;
          pxVar2 = xmlBufContent(buf_00->conv);
          pxVar2 = xmlStrndup(pxVar2,*size);
          *mem = pxVar2;
        }
        xmlOutputBufferClose(buf_00);
      }
    }
  }
  return;
}

Assistant:

void
htmlDocDumpMemoryFormat(xmlDocPtr cur, xmlChar**mem, int *size, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;

    xmlInitParser();

    if ((mem == NULL) || (size == NULL))
        return;
    if (cur == NULL) {
	*mem = NULL;
	*size = 0;
	return;
    }

    encoding = (const char *) htmlGetMetaEncoding(cur);

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
                htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);

	}
    } else {
        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    buf = xmlAllocOutputBufferInternal(handler);
    if (buf == NULL) {
	*mem = NULL;
	*size = 0;
	return;
    }

    htmlDocContentDumpFormatOutput(buf, cur, NULL, format);

    xmlOutputBufferFlush(buf);
    if (buf->conv != NULL) {
	*size = xmlBufUse(buf->conv);
	*mem = xmlStrndup(xmlBufContent(buf->conv), *size);
    } else {
	*size = xmlBufUse(buf->buffer);
	*mem = xmlStrndup(xmlBufContent(buf->buffer), *size);
    }
    (void)xmlOutputBufferClose(buf);
}